

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_voxel_meshify.h
# Opt level: O2

uint32_t murmur_hash2_size4(uint32_t h,uint32_t *data,uint32_t data_len)

{
  uint32_t uVar1;
  undefined4 in_register_0000003c;
  int *piVar2;
  
  piVar2 = (int *)CONCAT44(in_register_0000003c,h);
  if (((ulong)data & 3) == 0) {
    uVar1 = 0;
    while( true ) {
      if ((uint)data < 4) break;
      uVar1 = uVar1 * 0x5bd1e995 ^
              ((uint)(*piVar2 * 0x5bd1e995) >> 0x18 ^ *piVar2 * 0x5bd1e995) * 0x5bd1e995;
      piVar2 = piVar2 + 1;
      data = (uint32_t *)(ulong)((uint)data - 4);
    }
    return uVar1;
  }
  __assert_fail("data_len % 4 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                ,0x162,"uint32_t murmur_hash2_size4(uint32_t, const uint32_t *, uint32_t)");
}

Assistant:

static uint32_t murmur_hash2_size4(uint32_t h, const uint32_t* data, uint32_t data_len) {
    assert(data_len % 4 == 0);	
    const uint32_t m = 0x5bd1e995;
    while (data_len >= 4) {
        uint32_t k = data[0];
        k *= m;
        k ^= k >> (signed)24;
        k *= m;
        h *= m;
        h ^= k;
        data++;
        data_len -= 4;
    }

    return h;
}